

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gls::MixedRelinkHoleAttributeTest::iterate(MixedRelinkHoleAttributeTest *this)

{
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int iVar2;
  deUint32 layoutLocation;
  int ndx;
  undefined1 local_1c8 [44];
  deInt32 local_19c;
  string local_198;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  preLinkBindings;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  postLinkBindings;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  Attribute local_f8;
  AttribType vec4;
  string local_50;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_19c = anon_unknown_1::getMaxAttributeLocations(this->m_renderCtx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"vec4",(allocator<char> *)local_1c8);
  std::__cxx11::string::string((string *)&vec4,(string *)&local_f8);
  vec4.m_locationSize = 1;
  vec4.m_glTypeEnum = 0x8b52;
  std::__cxx11::string::~string((string *)&local_f8);
  iVar2 = 1;
  if (this->m_arraySize != -1) {
    iVar2 = this->m_arraySize;
  }
  preLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  preLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  preLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  postLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  postLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  postLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"a_0",(allocator<char> *)&local_50);
  AttributeLocationTestUtil::Cond::Cond((Cond *)local_1c8,COND_ALWAYS);
  AttributeLocationTestUtil::Attribute::Attribute
            (&local_f8,&vec4,&local_198,-1,(Cond *)local_1c8,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_f8);
  AttributeLocationTestUtil::Attribute::~Attribute(&local_f8);
  std::__cxx11::string::~string((string *)(local_1c8 + 8));
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"a_0",(allocator<char> *)&local_198);
  std::__cxx11::string::string((string *)&local_f8,(string *)local_1c8);
  local_f8.m_type.m_locationSize = 0;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&preLinkBindings,(Bind *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"a_1",(allocator<char> *)&local_50);
  AttributeLocationTestUtil::Cond::Cond((Cond *)local_1c8,COND_ALWAYS);
  AttributeLocationTestUtil::Attribute::Attribute
            (&local_f8,&this->m_type,&local_198,-1,(Cond *)local_1c8,this->m_arraySize);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_f8);
  AttributeLocationTestUtil::Attribute::~Attribute(&local_f8);
  std::__cxx11::string::~string((string *)(local_1c8 + 8));
  std::__cxx11::string::~string((string *)&local_198);
  ndx = 2;
  layoutLocation = iVar2 * (this->m_type).m_locationSize;
  uVar1 = 0;
  while (layoutLocation = layoutLocation + 1, (int)layoutLocation < local_19c) {
    if ((uVar1 & 1) == 0) {
      de::toString<int>(&local_50,&ndx);
      std::operator+(&local_198,"a_",&local_50);
      AttributeLocationTestUtil::Cond::Cond((Cond *)local_1c8,COND_ALWAYS);
      AttributeLocationTestUtil::Attribute::Attribute
                (&local_f8,&vec4,&local_198,-1,(Cond *)local_1c8,-1);
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_f8);
      AttributeLocationTestUtil::Attribute::~Attribute(&local_f8);
      std::__cxx11::string::~string((string *)(local_1c8 + 8));
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_50);
      de::toString<int>(&local_198,&ndx);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     "a_",&local_198);
      std::__cxx11::string::string((string *)&local_f8,(string *)local_1c8);
      local_f8.m_type.m_locationSize = layoutLocation;
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&preLinkBindings,(Bind *)&local_f8)
      ;
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)local_1c8);
      this_00 = &local_198;
    }
    else {
      de::toString<int>(&local_50,&ndx);
      std::operator+(&local_198,"a_",&local_50);
      AttributeLocationTestUtil::Cond::Cond((Cond *)local_1c8,COND_ALWAYS);
      AttributeLocationTestUtil::Attribute::Attribute
                (&local_f8,&vec4,&local_198,layoutLocation,(Cond *)local_1c8,-1);
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_f8);
      AttributeLocationTestUtil::Attribute::~Attribute(&local_f8);
      std::__cxx11::string::~string((string *)(local_1c8 + 8));
      std::__cxx11::string::~string((string *)&local_198);
      this_00 = &local_50;
    }
    std::__cxx11::string::~string((string *)this_00);
    ndx = ndx + 1;
    uVar1 = ndx;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"a_2",(allocator<char> *)&local_198);
  std::__cxx11::string::string((string *)&local_f8,(string *)local_1c8);
  local_f8.m_type.m_locationSize = 1;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&postLinkBindings,(Bind *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_1c8);
  local_f8.m_type.m_name._M_dataplus._M_p = (pointer)0x0;
  local_f8.m_type.m_name._M_string_length = 0;
  local_f8.m_type.m_name.field_2._M_allocated_capacity = 0;
  AttributeLocationTestUtil::runTest
            ((this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,&attributes,
             &noBindings,&preLinkBindings,&postLinkBindings,true,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&local_f8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&local_f8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&postLinkBindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&preLinkBindings);
  std::__cxx11::string::~string((string *)&vec4);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult MixedRelinkHoleAttributeTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const deInt32		maxAttributes		= getMaxAttributeLocations(m_renderCtx);
	const AttribType	vec4				("vec4", 1, GL_FLOAT_VEC4);
	const int			arrayElementCount	= (m_arraySize != Attribute::NOT_ARRAY ? m_arraySize : 1);

	vector<Bind>		preLinkBindings;
	vector<Bind>		postLinkBindings;
	vector<Attribute>	attributes;
	int					ndx;

	attributes.push_back(Attribute(vec4, "a_0"));
	preLinkBindings.push_back(Bind("a_0", 0));

	attributes.push_back(Attribute(m_type, "a_1", Attribute::LOC_UNDEF, Cond::COND_ALWAYS, m_arraySize));

	ndx = 2;
	for (int loc = 1 + m_type.getLocationSize() * arrayElementCount; loc < maxAttributes; loc++)
	{
		if ((ndx % 2) != 0)
			attributes.push_back(Attribute(vec4, "a_" + de::toString(ndx), loc));
		else
		{
			attributes.push_back(Attribute(vec4, "a_" + de::toString(ndx)));
			preLinkBindings.push_back(Bind("a_" + de::toString(ndx), loc));

		}
		ndx++;
	}

	postLinkBindings.push_back(Bind("a_2", 1));

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, preLinkBindings, postLinkBindings, true);
	return STOP;
}